

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extensions.cc
# Opt level: O1

bool bssl::ext_npn_add_serverhello(SSL_HANDSHAKE *hs,CBB *out)

{
  _Head_base<0UL,_ssl_ctx_st_*,_false> _Var1;
  int iVar2;
  bool bVar3;
  uint npa_len;
  uint8_t *npa;
  CBB contents;
  uint local_4c;
  uint8_t *local_48;
  CBB local_40;
  
  bVar3 = true;
  if ((hs->field_0x6c9 & 0x80) != 0) {
    _Var1._M_head_impl =
         (hs->ssl->ctx)._M_t.super___uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>._M_t.
         super__Tuple_impl<0UL,_ssl_ctx_st_*,_bssl::internal::Deleter>.
         super__Head_base<0UL,_ssl_ctx_st_*,_false>._M_head_impl;
    iVar2 = (*(_Var1._M_head_impl)->next_protos_advertised_cb)
                      (hs->ssl,&local_48,&local_4c,
                       (_Var1._M_head_impl)->next_protos_advertised_cb_arg);
    if (iVar2 == 0) {
      iVar2 = CBB_add_u16(out,0x3374);
      if (((iVar2 == 0) || (iVar2 = CBB_add_u16_length_prefixed(out,&local_40), iVar2 == 0)) ||
         (iVar2 = CBB_add_bytes(&local_40,local_48,(ulong)local_4c), iVar2 == 0)) {
        bVar3 = false;
      }
      else {
        iVar2 = CBB_flush(out);
        bVar3 = iVar2 != 0;
      }
    }
    else {
      hs->field_0x6c9 = hs->field_0x6c9 & 0x7f;
      bVar3 = true;
    }
  }
  return bVar3;
}

Assistant:

static bool ext_npn_add_serverhello(SSL_HANDSHAKE *hs, CBB *out) {
  SSL *const ssl = hs->ssl;
  // |next_proto_neg_seen| might have been cleared when an ALPN extension was
  // parsed.
  if (!hs->next_proto_neg_seen) {
    return true;
  }

  const uint8_t *npa;
  unsigned npa_len;

  if (ssl->ctx->next_protos_advertised_cb(
          ssl, &npa, &npa_len, ssl->ctx->next_protos_advertised_cb_arg) !=
      SSL_TLSEXT_ERR_OK) {
    hs->next_proto_neg_seen = false;
    return true;
  }

  CBB contents;
  if (!CBB_add_u16(out, TLSEXT_TYPE_next_proto_neg) ||  //
      !CBB_add_u16_length_prefixed(out, &contents) ||   //
      !CBB_add_bytes(&contents, npa, npa_len) ||        //
      !CBB_flush(out)) {
    return false;
  }

  return true;
}